

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmGlobalUnixMakefileGenerator3::AppendGlobalTargetDepends
          (cmGlobalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,cmGeneratorTarget *target)

{
  bool bVar1;
  TargetType TVar2;
  set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_> *this_00;
  reference this_01;
  cmGeneratorTarget *this_02;
  undefined1 local_78 [8];
  string tgtName;
  cmLocalUnixMakefileGenerator3 *lg3;
  cmGeneratorTarget *dep;
  cmTargetDepend *i;
  iterator __end1;
  iterator __begin1;
  TargetDependSet *__range1;
  TargetDependSet *depends_set;
  cmGeneratorTarget *target_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *depends_local;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  this_00 = &cmGlobalGenerator::GetTargetDirectDepends((cmGlobalGenerator *)this,target)->
             super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>;
  __end1 = std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::
           begin(this_00);
  i = (cmTargetDepend *)
      std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::end
                (this_00);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&i), bVar1) {
    this_01 = std::_Rb_tree_const_iterator<cmTargetDepend>::operator*(&__end1);
    this_02 = cmTargetDepend::operator_cast_to_cmGeneratorTarget_(this_01);
    TVar2 = cmGeneratorTarget::GetType(this_02);
    if (TVar2 != INTERFACE_LIBRARY) {
      tgtName.field_2._8_8_ = cmGeneratorTarget::GetLocalGenerator(this_02);
      cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                ((string *)local_78,(cmLocalUnixMakefileGenerator3 *)tgtName.field_2._8_8_,this_02);
      std::__cxx11::string::operator+=((string *)local_78,"/all");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(depends,(value_type *)local_78);
      std::__cxx11::string::~string((string *)local_78);
    }
    std::_Rb_tree_const_iterator<cmTargetDepend>::operator++(&__end1);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::AppendGlobalTargetDepends(
  std::vector<std::string>& depends, cmGeneratorTarget* target)
{
  TargetDependSet const& depends_set = this->GetTargetDirectDepends(target);
  for (cmTargetDepend const& i : depends_set) {
    // Create the target-level dependency.
    cmGeneratorTarget const* dep = i;
    if (dep->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    cmLocalUnixMakefileGenerator3* lg3 =
      static_cast<cmLocalUnixMakefileGenerator3*>(dep->GetLocalGenerator());
    std::string tgtName =
      lg3->GetRelativeTargetDirectory(const_cast<cmGeneratorTarget*>(dep));
    tgtName += "/all";
    depends.push_back(tgtName);
  }
}